

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

enable_if_t<std::is_integral<unsigned_int>::value,_bool>
math::wide_integer::operator==(uintwide_t<32U,_unsigned_short,_void,_false> *u,uint *v)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  short local_c [2];
  
  uVar3 = *v;
  local_c[0] = 0;
  local_c[1] = 0;
  lVar2 = 0;
  if (uVar3 != 0) {
    do {
      lVar1 = lVar2;
      *(short *)((long)local_c + lVar1) = (short)uVar3;
      lVar2 = lVar1 + 2;
      if (uVar3 < 0x10000) break;
      uVar3 = uVar3 >> 0x10;
    } while (lVar1 != 2);
    if (lVar1 == 2) goto LAB_0013f04f;
  }
  memset((void *)((long)local_c + lVar2),0,4 - lVar2);
LAB_0013f04f:
  lVar2 = 2;
  do {
    lVar1 = lVar2;
    if (lVar1 == -2) break;
    lVar2 = lVar1 + -2;
  } while (*(short *)((long)(u->values).super_array<unsigned_short,_2UL>.elems + lVar1) ==
           *(short *)((long)local_c + lVar1));
  return lVar1 == -2;
}

Assistant:

constexpr auto operator!=(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const IntegralType& v) -> std::enable_if_t<std::is_integral<IntegralType>::value, bool> { return u.operator!=(uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(v)); }